

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::alignedTo(String *this,int length,int side,char fill)

{
  undefined7 in_register_00000009;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar1;
  undefined4 in_register_00000034;
  String SVar2;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  String local_80 [2];
  String local_60;
  String local_50;
  String local_40;
  int local_30;
  int local_2c;
  int rightCount;
  int leftCount;
  int diffInSize;
  int iStack_1c;
  char fill_local;
  int side_local;
  int length_local;
  String *this_local;
  
  _side_local = (String *)CONCAT44(in_register_00000034,length);
  diffInSize = (int)CONCAT71(in_register_00000009,fill);
  iStack_1c = side;
  this_local = this;
  if (side < (_side_local->super_tagbstring).slen) {
    String(this,_side_local);
    puVar1 = extraout_RDX;
  }
  else {
    rightCount = side - (_side_local->super_tagbstring).slen;
    local_9c = rightCount;
    if (diffInSize != 1) {
      if (diffInSize == 0) {
        local_a0 = rightCount / 2;
      }
      else {
        local_a0 = 0;
      }
      local_9c = local_a0;
    }
    local_2c = local_9c;
    local_a4 = rightCount;
    if (diffInSize != -1) {
      if (diffInSize == 0) {
        local_a8 = (rightCount + 1) / 2;
      }
      else {
        local_a8 = 0;
      }
      local_a4 = local_a8;
    }
    local_30 = local_a4;
    String(&local_60);
    Filled(&local_50,(int)&local_60,(uchar)local_2c);
    operator+(&local_40,&local_50);
    Filled(local_80,length,(uchar)local_30);
    operator+(this,&local_40);
    ~String(local_80);
    ~String(&local_40);
    ~String(&local_50);
    ~String(&local_60);
    puVar1 = extraout_RDX_00;
  }
  SVar2.super_tagbstring.data = puVar1;
  SVar2.super_tagbstring._0_8_ = this;
  return (String)SVar2.super_tagbstring;
}

Assistant:

String String::alignedTo(const int length, int side, char fill) const
    {
        if (slen > length) return *this;
        int diffInSize = (length - slen),
            leftCount = side == 1 ? diffInSize : (side == 0 ? diffInSize / 2 : 0),
            rightCount = side == -1 ? diffInSize : (side == 0 ? (diffInSize + 1) / 2 : 0);

        return String().Filled(leftCount, fill) + *this + Filled(rightCount, fill);
    }